

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswDyn.c
# Opt level: O0

void Ssw_ManSweepTransferDyn(Ssw_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  uint *puVar7;
  int local_30;
  int nFrames;
  int f;
  int i;
  uint *pInfo;
  Aig_Obj_t *pObjFraig;
  Aig_Obj_t *pObj;
  Ssw_Man_t *p_local;
  
  for (nFrames = 0; iVar2 = Vec_PtrSize(p->pAig->vCis), nFrames < iVar2; nFrames = nFrames + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,nFrames);
    pAVar6 = Ssw_ObjFrame(p,pAVar4,0);
    pAVar5 = Aig_ManConst0(p->pFrames);
    if (pAVar6 == pAVar5) {
      Ssw_SmlObjAssignConst(p->pSml,pAVar4,0,0);
    }
    else {
      iVar2 = Aig_IsComplement(pAVar6);
      if (iVar2 != 0) {
        __assert_fail("!Aig_IsComplement(pObjFraig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswDyn.c"
                      ,0xe2,"void Ssw_ManSweepTransferDyn(Ssw_Man_t *)");
      }
      iVar2 = Aig_ObjIsCi(pAVar6);
      if (iVar2 == 0) {
        __assert_fail("Aig_ObjIsCi(pObjFraig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswDyn.c"
                      ,0xe3,"void Ssw_ManSweepTransferDyn(Ssw_Man_t *)");
      }
      pVVar1 = p->vSimInfo;
      iVar2 = Aig_ObjCioId(pAVar6);
      puVar7 = (uint *)Vec_PtrEntry(pVVar1,iVar2);
      Ssw_SmlObjSetWord(p->pSml,pAVar4,*puVar7,0,0);
    }
  }
  local_30 = 1;
  do {
    if (p->nFrames <= local_30) {
      iVar2 = Ssw_SmlNumFrames(p->pSml);
      for (; local_30 < iVar2; local_30 = local_30 + 1) {
        for (nFrames = 0; iVar3 = Saig_ManPiNum(p->pAig), nFrames < iVar3; nFrames = nFrames + 1) {
          pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,nFrames);
          Ssw_SmlAssignRandomFrame(p->pSml,pAVar4,local_30);
        }
      }
      return;
    }
    for (nFrames = 0; iVar2 = Saig_ManPiNum(p->pAig), nFrames < iVar2; nFrames = nFrames + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,nFrames);
      pAVar6 = Ssw_ObjFrame(p,pAVar4,local_30);
      iVar2 = Aig_IsComplement(pAVar6);
      if (iVar2 != 0) {
        __assert_fail("!Aig_IsComplement(pObjFraig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswDyn.c"
                      ,0xed,"void Ssw_ManSweepTransferDyn(Ssw_Man_t *)");
      }
      iVar2 = Aig_ObjIsCi(pAVar6);
      if (iVar2 == 0) {
        __assert_fail("Aig_ObjIsCi(pObjFraig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswDyn.c"
                      ,0xee,"void Ssw_ManSweepTransferDyn(Ssw_Man_t *)");
      }
      pVVar1 = p->vSimInfo;
      iVar2 = Aig_ObjCioId(pAVar6);
      puVar7 = (uint *)Vec_PtrEntry(pVVar1,iVar2);
      Ssw_SmlObjSetWord(p->pSml,pAVar4,*puVar7,0,local_30);
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

void Ssw_ManSweepTransferDyn( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj, * pObjFraig;
    unsigned * pInfo;
    int i, f, nFrames;

    // transfer simulation information
    Aig_ManForEachCi( p->pAig, pObj, i )
    {
        pObjFraig = Ssw_ObjFrame( p, pObj, 0 );
        if ( pObjFraig == Aig_ManConst0(p->pFrames) )
        {
            Ssw_SmlObjAssignConst( p->pSml, pObj, 0, 0 );
            continue;
        }
        assert( !Aig_IsComplement(pObjFraig) );
        assert( Aig_ObjIsCi(pObjFraig) );
        pInfo = (unsigned *)Vec_PtrEntry( p->vSimInfo, Aig_ObjCioId(pObjFraig) );
        Ssw_SmlObjSetWord( p->pSml, pObj, pInfo[0], 0, 0 );
    }
    // set random simulation info for the second frame
    for ( f = 1; f < p->nFrames; f++ )
    {
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjFraig = Ssw_ObjFrame( p, pObj, f );
            assert( !Aig_IsComplement(pObjFraig) );
            assert( Aig_ObjIsCi(pObjFraig) );
            pInfo = (unsigned *)Vec_PtrEntry( p->vSimInfo, Aig_ObjCioId(pObjFraig) );
            Ssw_SmlObjSetWord( p->pSml, pObj, pInfo[0], 0, f );
        }
    }
    // create random info
    nFrames = Ssw_SmlNumFrames( p->pSml );
    for ( ; f < nFrames; f++ )
    {
        Saig_ManForEachPi( p->pAig, pObj, i )
            Ssw_SmlAssignRandomFrame( p->pSml, pObj, f );
    }
}